

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O3

void PHF::compact(phf *phf)

{
  anon_enum_32 aVar1;
  uint32_t *puVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  
  if (phf->g_op - PHF_G_UINT32_MOD_R < 2) {
    if (phf->d_max < 0x100) {
      sVar5 = phf->r;
      puVar2 = phf->g;
      if (sVar5 == 0) {
        sVar5 = 0;
      }
      else {
        sVar3 = 0;
        do {
          *(char *)((long)puVar2 + sVar3) = (char)puVar2[sVar3];
          sVar3 = sVar3 + 1;
        } while (sVar5 != sVar3);
        sVar5 = phf->r;
        puVar2 = phf->g;
      }
      aVar1 = phf->nodiv + PHF_G_UINT8_MOD_R;
      lVar4 = 1;
    }
    else {
      if (0xffff < phf->d_max) {
        return;
      }
      sVar5 = phf->r;
      puVar2 = phf->g;
      if (sVar5 != 0) {
        sVar3 = 0;
        do {
          *(short *)((long)puVar2 + sVar3 * 2) = (short)puVar2[sVar3];
          sVar3 = sVar3 + 1;
        } while (sVar5 != sVar3);
      }
      aVar1 = phf->nodiv + PHF_G_UINT16_MOD_R;
      lVar4 = 2;
    }
    phf->g_op = aVar1;
    puVar2 = (uint32_t *)realloc(puVar2,sVar5 * lVar4);
    if (puVar2 != (uint32_t *)0x0) {
      phf->g = puVar2;
    }
  }
  return;
}

Assistant:

PHF_PUBLIC void PHF::compact(struct phf *phf) {
	size_t size = 0;
	void *tmp;

	switch (phf->g_op) {
	case phf::PHF_G_UINT32_MOD_R:
	case phf::PHF_G_UINT32_BAND_R:
		break;
	default:
		return; /* already compacted */
	}

	if (phf->d_max <= 255) {
		phf_memmove(reinterpret_cast<uint8_t *>(phf->g), reinterpret_cast<uint32_t *>(phf->g), phf->r);
		phf->g_op = (phf->nodiv)? phf::PHF_G_UINT8_BAND_R : phf::PHF_G_UINT8_MOD_R;
		size = sizeof (uint8_t);
	} else if (phf->d_max <= 65535) {
		phf_memmove(reinterpret_cast<uint16_t *>(phf->g), reinterpret_cast<uint32_t *>(phf->g), phf->r);
		phf->g_op = (phf->nodiv)? phf::PHF_G_UINT16_BAND_R : phf::PHF_G_UINT16_MOD_R;
		size = sizeof (uint16_t);
	} else {
		return; /* nothing to compact */
	}

	/* simply keep old array if realloc fails */
	if ((tmp = realloc(phf->g, phf->r * size)))
		phf->g = static_cast<uint32_t *>(tmp);
}